

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

char * cmCapitalized(char *name)

{
  char *__dest;
  string sres;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,name,&local_51);
  cmsys::SystemTools::Capitalized(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  __dest = (char *)malloc(local_30._M_string_length + 1);
  strcpy(__dest,local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return __dest;
}

Assistant:

char * CCONV cmCapitalized(const char *name)
{
  std::string sres = cmSystemTools::Capitalized(name);
  char *result = (char *)malloc(sres.size()+1);
  strcpy(result,sres.c_str());
  return result;
}